

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O3

int custom_recv(tr_socket *socket,void *buf,size_t len,time_t timeout)

{
  long lVar1;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = data_size - data_index;
  if (data_index + len <= data_size) {
    __n = len;
  }
  memcpy(buf,data + data_index,__n);
  data_index = data_index + __n;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)__n;
  }
  __stack_chk_fail();
}

Assistant:

static int custom_recv(const struct tr_socket *socket __attribute__((unused)), const void *buf, const size_t len,
		       const time_t timeout __attribute__((unused)))
{
	size_t rlen = len;

	if (data_index + rlen > data_size)
		rlen = data_size - data_index;

	memcpy((char *)buf, data + data_index, rlen);
	data_index += rlen;
	return rlen;
}